

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O0

int __thiscall
btHashMap<btHashKey<btTriIndex>,_btTriIndex>::findIndex
          (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this,btHashKey<btTriIndex> *key)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  btHashKey<btTriIndex> *in_RSI;
  btAlignedObjectArray<int> *in_RDI;
  int index;
  uint hash;
  btHashKey<btTriIndex> *in_stack_ffffffffffffffb8;
  btHashKey<btTriIndex> *this_00;
  int local_20;
  int local_4;
  
  uVar2 = btHashKey<btTriIndex>::getHash(in_RSI);
  iVar3 = btAlignedObjectArray<btTriIndex>::capacity
                    ((btAlignedObjectArray<btTriIndex> *)(in_RDI + 2));
  uVar2 = uVar2 & iVar3 - 1U;
  uVar4 = btAlignedObjectArray<int>::size(in_RDI);
  if (uVar2 < uVar4) {
    piVar5 = btAlignedObjectArray<int>::operator[](in_RDI,uVar2);
    local_20 = *piVar5;
    while( true ) {
      bVar1 = false;
      if (local_20 != -1) {
        this_00 = in_RSI;
        btAlignedObjectArray<btHashKey<btTriIndex>_>::operator[]
                  ((btAlignedObjectArray<btHashKey<btTriIndex>_> *)(in_RDI + 3),local_20);
        bVar1 = btHashKey<btTriIndex>::equals(this_00,in_stack_ffffffffffffffb8);
        bVar1 = !bVar1;
      }
      if (!bVar1) break;
      piVar5 = btAlignedObjectArray<int>::operator[](in_RDI + 1,local_20);
      local_20 = *piVar5;
    }
    local_4 = local_20;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int	findIndex(const Key& key) const
	{
		unsigned int hash = key.getHash() & (m_valueArray.capacity()-1);

		if (hash >= (unsigned int)m_hashTable.size())
		{
			return BT_HASH_NULL;
		}

		int index = m_hashTable[hash];
		while ((index != BT_HASH_NULL) && key.equals(m_keyArray[index]) == false)
		{
			index = m_next[index];
		}
		return index;
	}